

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void sx_semaphore_init(sx_sem *sem)

{
  code *pcVar1;
  int iVar2;
  
  sem->data[0x58] = '\0';
  sem->data[0x59] = '\0';
  sem->data[0x5a] = '\0';
  sem->data[0x5b] = '\0';
  iVar2 = pthread_mutex_init((pthread_mutex_t *)sem,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x19a,"pthread_mutex_init failed");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  iVar2 = pthread_cond_init((pthread_cond_t *)(sem->data + 0x28),(pthread_condattr_t *)0x0);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x19d,"pthread_cond_init failed");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  return;
}

Assistant:

void sx_semaphore_init(sx_sem* sem)
{
    sx__sem* _sem = (sx__sem*)sem->data;
    _sem->count = 0;
    int r = pthread_mutex_init(&_sem->mutex, NULL);
    sx_assertf(r == 0, "pthread_mutex_init failed");

    r = pthread_cond_init(&_sem->cond, NULL);
    sx_assertf(r == 0, "pthread_cond_init failed");

    sx_unused(r);
}